

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_CURSE_WEAPON(effect_handler_context_t_conflict *context)

{
  byte bVar1;
  byte bVar2;
  int16_t iVar3;
  int16_t iVar4;
  uint32_t uVar5;
  object *obj_00;
  wchar_t power;
  wchar_t pick;
  wchar_t old_weight;
  wchar_t max_tries;
  wchar_t num;
  char o_name [80];
  object *obj;
  effect_handler_context_t_conflict *context_local;
  
  obj_00 = equipped_item_by_slot_name(player,"weapon");
  if (obj_00 != (object *)0x0) {
    object_desc((char *)&max_tries,0x50,obj_00,3,player);
    if ((obj_00->artifact == (artifact *)0x0) || (uVar5 = Rand_div(100), 0x31 < (int)uVar5)) {
      uVar5 = Rand_div(3);
      old_weight = uVar5 + L'\x01';
      bVar1 = obj_00->number;
      iVar3 = object_weight_one(obj_00);
      msg("A terrible black aura blasts your %s!",&max_tries);
      uVar5 = Rand_div(3);
      obj_00->to_h = -((short)uVar5 + 1);
      uVar5 = Rand_div(3);
      obj_00->to_d = -((short)uVar5 + 1);
      while (old_weight != L'\0') {
        uVar5 = Rand_div(z_info->curse_max - 1);
        iVar4 = m_bonus(9,(int)player->depth);
        if ((curses[uVar5 + L'\x01'].poss[obj_00->tval] & 1U) != 0) {
          append_object_curse(obj_00,uVar5 + L'\x01',iVar4 * 10);
          old_weight = old_weight + L'\xffffffff';
        }
      }
      bVar2 = obj_00->number;
      iVar4 = object_weight_one(obj_00);
      player->upkeep->total_weight =
           ((uint)bVar2 * (int)iVar4 - (uint)bVar1 * (int)iVar3) + player->upkeep->total_weight;
      player->upkeep->update = player->upkeep->update | 1;
      player->upkeep->update = player->upkeep->update | 8;
      player->upkeep->redraw = player->upkeep->redraw | 0x60000;
    }
    else {
      msg("A %s tries to %s, but your %s resists the effects!","terrible black aura",
          "surround your weapon",&max_tries);
    }
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_CURSE_WEAPON(effect_handler_context_t *context)
{
	struct object *obj;

	char o_name[80];

	/* Curse the weapon */
	obj = equipped_item_by_slot_name(player, "weapon");

	/* Nothing to curse */
	if (!obj) return (true);

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_FULL, player);

	/* Attempt a saving throw */
	if (obj->artifact && (randint0(100) < 50)) {
		msg("A %s tries to %s, but your %s resists the effects!",
				   "terrible black aura", "surround your weapon", o_name);
	} else {
		int num = randint1(3);
		int max_tries = 20;
		int old_weight = obj->number * object_weight_one(obj);

		msg("A terrible black aura blasts your %s!", o_name);

		/* Hurt it a bit */
		obj->to_h = 0 - randint1(3);
		obj->to_d = 0 - randint1(3);

		/* Curse it */
		while (num) {
			int pick = randint1(z_info->curse_max - 1);
			int power = 10 * m_bonus(9, player->depth);
			if (!curses[pick].poss[obj->tval]) {
				max_tries--;
				continue;
			}
			append_object_curse(obj, pick, power);
			num--;
		}

		/* Account for a weight change, if any */
		player->upkeep->total_weight +=
			(obj->number * object_weight_one(obj)) - old_weight;

		/* Recalculate bonuses */
		player->upkeep->update |= (PU_BONUS);

		/* Recalculate mana */
		player->upkeep->update |= (PU_MANA);

		/* Window stuff */
		player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
	}

	context->ident = true;

	/* Notice */
	return (true);
}